

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O1

void nk_glfw3_render(nk_glfw *glfw,nk_anti_aliasing AA,int max_vertex_buffer,int max_element_buffer)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  void *m;
  uint *puVar4;
  bool bVar5;
  nk_buffer vbuf;
  nk_convert_config config;
  nk_buffer ebuf;
  nk_buffer local_1a0;
  nk_convert_config local_128;
  ulong local_e8 [3];
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  nk_buffer local_a8;
  
  local_e8[1] = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0xbf800000;
  local_b8 = 0x3f800000bf800000;
  uStack_b0 = 0x3f80000000000000;
  local_e8[0] = (ulong)(uint)(2.0 / (float)glfw->width);
  local_e8[2] = (ulong)(uint)(-2.0 / (float)glfw->height) << 0x20;
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendEquation)(0x8006);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glEnable)(0xc11);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glUseProgram)((glfw->ogl).prog);
  puVar4 = (uint *)0x0;
  (*glad_glUniform1i)((glfw->ogl).uniform_tex,0);
  (*glad_glUniformMatrix4fv)((glfw->ogl).uniform_proj,1,'\0',(GLfloat *)local_e8);
  (*glad_glViewport)(0,0,glfw->display_width,glfw->display_height);
  (*glad_glBindVertexArray)((glfw->ogl).vao);
  (*glad_glBindBuffer)(0x8892,(glfw->ogl).vbo);
  (*glad_glBindBuffer)(0x8893,(glfw->ogl).ebo);
  (*glad_glBufferData)(0x8892,(long)max_vertex_buffer,(void *)0x0,0x88e0);
  (*glad_glBufferData)(0x8893,(long)max_element_buffer,(void *)0x0,0x88e0);
  pvVar3 = (*glad_glMapBuffer)(0x8892,0x88b9);
  m = (*glad_glMapBuffer)(0x8893,0x88b9);
  local_128.vertex_layout = nk_glfw3_render::vertex_layout;
  local_128.vertex_size = 0x14;
  local_128.vertex_alignment = 4;
  local_128.null.texture = (glfw->ogl).null.texture;
  local_128.null.uv = (glfw->ogl).null.uv;
  local_128.arc_segment_count = 0x16;
  local_128.curve_segment_count = 0x16;
  local_128.circle_segment_count = 0x16;
  local_128.shape_AA = AA;
  local_128.line_AA = AA;
  local_128.global_alpha = 1.0;
  nk_buffer_init_fixed(&local_1a0,pvVar3,(long)max_vertex_buffer);
  nk_buffer_init_fixed(&local_a8,m,(long)max_element_buffer);
  nk_convert(&glfw->ctx,&(glfw->ogl).cmds,&local_1a0,&local_a8,&local_128);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glUnmapBuffer)(0x8893);
  if ((glfw->ogl).cmds.size != 0) {
    if ((glfw->ctx).draw_list.cmd_count == 0) {
      puVar4 = (uint *)0x0;
    }
    else {
      puVar4 = (uint *)(((glfw->ogl).cmds.memory.size - (glfw->ctx).draw_list.cmd_offset) +
                       (long)(glfw->ogl).cmds.memory.ptr);
    }
  }
  if (puVar4 != (uint *)0x0) {
    pvVar3 = (void *)0x0;
    do {
      if (*puVar4 != 0) {
        (*glad_glBindTexture)(0xde1,puVar4[6]);
        fVar1 = (glfw->fb_scale).x;
        fVar2 = (glfw->fb_scale).y;
        (*glad_glScissor)((int)((float)puVar4[1] * fVar1),
                          (int)((float)(glfw->height - (int)((float)puVar4[2] + (float)puVar4[4])) *
                               fVar2),(int)(fVar1 * (float)puVar4[3]),
                          (int)((float)puVar4[4] * fVar2));
        (*glad_glDrawElements)(4,*puVar4,0x1403,pvVar3);
        pvVar3 = (void *)((long)pvVar3 + (ulong)*puVar4 * 2);
      }
      bVar5 = (uint *)((long)(glfw->ogl).cmds.memory.ptr +
                      (ulong)((glfw->ctx).draw_list.cmd_count - 1) * -0x20 +
                      ((glfw->ogl).cmds.memory.size - (glfw->ctx).draw_list.cmd_offset)) < puVar4;
      puVar4 = puVar4 + -8;
    } while (bVar5);
  }
  nk_clear(&glfw->ctx);
  (glfw->ogl).cmds.allocated = 0;
  (glfw->ogl).cmds.size = (glfw->ogl).cmds.memory.size;
  (glfw->ogl).cmds.needed = 0;
  (glfw->ogl).cmds.calls = 0;
  (*glad_glUseProgram)(0);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBuffer)(0x8893,0);
  (*glad_glBindVertexArray)(0);
  (*glad_glDisable)(0xbe2);
  (*glad_glDisable)(0xc11);
  return;
}

Assistant:

NK_API void
nk_glfw3_render(struct nk_glfw* glfw, enum nk_anti_aliasing AA, int max_vertex_buffer, int max_element_buffer)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    struct nk_buffer vbuf, ebuf;
    GLfloat ortho[4][4] = {
        {2.0f, 0.0f, 0.0f, 0.0f},
        {0.0f,-2.0f, 0.0f, 0.0f},
        {0.0f, 0.0f,-1.0f, 0.0f},
        {-1.0f,1.0f, 0.0f, 1.0f},
    };
    ortho[0][0] /= (GLfloat)glfw->width;
    ortho[1][1] /= (GLfloat)glfw->height;

    /* setup global state */
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
    glActiveTexture(GL_TEXTURE0);

    /* setup program */
    glUseProgram(dev->prog);
    glUniform1i(dev->uniform_tex, 0);
    glUniformMatrix4fv(dev->uniform_proj, 1, GL_FALSE, &ortho[0][0]);
    glViewport(0,0,(GLsizei)glfw->display_width,(GLsizei)glfw->display_height);
    {
        /* convert from command queue into draw list and draw to screen */
        const struct nk_draw_command *cmd;
        void *vertices, *elements;
        const nk_draw_index *offset = NULL;

        /* allocate vertex and element buffer */
        glBindVertexArray(dev->vao);
        glBindBuffer(GL_ARRAY_BUFFER, dev->vbo);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, dev->ebo);

        glBufferData(GL_ARRAY_BUFFER, max_vertex_buffer, NULL, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, max_element_buffer, NULL, GL_STREAM_DRAW);

        /* load draw vertices & elements directly into vertex + element buffer */
        vertices = glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
        elements = glMapBuffer(GL_ELEMENT_ARRAY_BUFFER, GL_WRITE_ONLY);
        {
            /* fill convert configuration */
            struct nk_convert_config config;
            static const struct nk_draw_vertex_layout_element vertex_layout[] = {
                {NK_VERTEX_POSITION, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, position)},
                {NK_VERTEX_TEXCOORD, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, uv)},
                {NK_VERTEX_COLOR, NK_FORMAT_R8G8B8A8, NK_OFFSETOF(struct nk_glfw_vertex, col)},
                {NK_VERTEX_LAYOUT_END}
            };
            NK_MEMSET(&config, 0, sizeof(config));
            config.vertex_layout = vertex_layout;
            config.vertex_size = sizeof(struct nk_glfw_vertex);
            config.vertex_alignment = NK_ALIGNOF(struct nk_glfw_vertex);
            config.null = dev->null;
            config.circle_segment_count = 22;
            config.curve_segment_count = 22;
            config.arc_segment_count = 22;
            config.global_alpha = 1.0f;
            config.shape_AA = AA;
            config.line_AA = AA;

            /* setup buffers to load vertices and elements */
            nk_buffer_init_fixed(&vbuf, vertices, (size_t)max_vertex_buffer);
            nk_buffer_init_fixed(&ebuf, elements, (size_t)max_element_buffer);
            nk_convert(&glfw->ctx, &dev->cmds, &vbuf, &ebuf, &config);
        }
        glUnmapBuffer(GL_ARRAY_BUFFER);
        glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);

        /* iterate over and execute each draw command */
        nk_draw_foreach(cmd, &glfw->ctx, &dev->cmds)
        {
            if (!cmd->elem_count) continue;
            glBindTexture(GL_TEXTURE_2D, (GLuint)cmd->texture.id);
            glScissor(
                (GLint)(cmd->clip_rect.x * glfw->fb_scale.x),
                (GLint)((glfw->height - (GLint)(cmd->clip_rect.y + cmd->clip_rect.h)) * glfw->fb_scale.y),
                (GLint)(cmd->clip_rect.w * glfw->fb_scale.x),
                (GLint)(cmd->clip_rect.h * glfw->fb_scale.y));
            glDrawElements(GL_TRIANGLES, (GLsizei)cmd->elem_count, GL_UNSIGNED_SHORT, offset);
            offset += cmd->elem_count;
        }
        nk_clear(&glfw->ctx);
        nk_buffer_clear(&dev->cmds);
    }

    /* default OpenGL state */
    glUseProgram(0);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
    glBindVertexArray(0);
    glDisable(GL_BLEND);
    glDisable(GL_SCISSOR_TEST);
}